

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

DispatchBuilder * __thiscall kern::DispatchBuilder::min_level(DispatchBuilder *this,LogLevel level)

{
  Dispatch *pDVar1;
  LogLevel LVar2;
  invalid_argument *this_00;
  undefined8 *puVar3;
  
  if (this->inner == (Dispatch *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_00108b38;
    __cxa_throw(puVar3,&BuilderReuseException::typeinfo,std::exception::~exception);
  }
  if ((level != 0) && (((int)(char)level & (int)(char)level - 1U) == 0)) {
    LVar2 = operator^(All,level - Trace);
    pDVar1 = this->inner;
    pDVar1->log_level = LVar2;
    pDVar1->is_def_level = false;
    return this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"level must not be a combined value");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DispatchBuilder &DispatchBuilder::min_level(LogLevel level) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        char lvl = static_cast<char>(level);
        if(lvl == 0 || (lvl & (lvl - 1)) != 0)
            throw std::invalid_argument("level must not be a combined value");

        this->inner->log_level = LogLevel::All ^ static_cast<LogLevel>(lvl - 1);
        this->inner->is_def_level = false;

        return *this;
    }